

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpreterStackFrame.cpp
# Opt level: O0

void __thiscall
Js::InterpreterStackFrame::OP_StartCall(InterpreterStackFrame *this,uint outParamCount)

{
  InterpreterStackFrame *pIVar1;
  code *pcVar2;
  bool bVar3;
  RegSlot RVar4;
  RegSlot RVar5;
  undefined4 *puVar6;
  uint outParamCount_local;
  InterpreterStackFrame *this_local;
  
  PushOut(this,*(Var *)(this + 0x28));
  *(undefined8 *)(this + 0x28) = *(undefined8 *)(this + 0x30);
  *(ulong *)(this + 0x30) = *(long *)(this + 0x30) + (ulong)outParamCount * 8;
  RVar4 = FunctionBody::GetLocalsCount(*(FunctionBody **)(this + 0x88));
  if (this + (ulong)RVar4 * 8 + 0x160 < *(InterpreterStackFrame **)(this + 0x30)) {
    pIVar1 = *(InterpreterStackFrame **)(this + 0x30);
    RVar4 = FunctionBody::GetLocalsCount(*(FunctionBody **)(this + 0x88));
    RVar5 = FunctionBody::GetOutParamMaxDepth(*(FunctionBody **)(this + 0x88));
    if (pIVar1 <= this + (ulong)RVar5 * 8 + (ulong)RVar4 * 8 + 0x160) {
      return;
    }
  }
  AssertCount = AssertCount + 1;
  Throw::LogAssert();
  puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
  *puVar6 = 1;
  bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/InterpreterStackFrame.cpp"
                              ,0xed3,
                              "(m_localSlots + this->m_functionBody->GetLocalsCount() < m_outSp && m_outSp <= (m_localSlots + this->m_functionBody->GetLocalsCount() + this->m_functionBody->GetOutParamMaxDepth()))"
                              ,"out args Stack pointer not in range after Push");
  if (bVar3) {
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 0;
    return;
  }
  pcVar2 = (code *)invalidInstructionException();
  (*pcVar2)();
}

Assistant:

void InterpreterStackFrame::OP_StartCall(uint outParamCount)
    {
        // Save the outParams for the current callsite on the outparam stack
        PushOut(m_outParams);

        // Update outParams for the indicated callsite
        m_outParams = m_outSp;

        m_outSp += outParamCount;

        AssertMsg(m_localSlots + this->m_functionBody->GetLocalsCount() < m_outSp &&
            m_outSp <= (m_localSlots + this->m_functionBody->GetLocalsCount() + this->m_functionBody->GetOutParamMaxDepth()),
            "out args Stack pointer not in range after Push");

    }